

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

_Bool binary_fuse16_populate(uint64_t *keys,uint32_t size,binary_fuse16_t *filter)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint16_t *puVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  uint32_t uVar12;
  int iVar13;
  uint uVar14;
  uint32_t uVar15;
  uint64_t uVar16;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *__ptr_04;
  ulong uVar17;
  uint64_t uVar18;
  ulong uVar19;
  uint32_t i_2;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  char cVar27;
  byte bVar28;
  uint uVar29;
  ulong length;
  ulong uVar30;
  _Bool _Var31;
  uint32_t i_1;
  uint uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  ulong local_e8;
  uint32_t h012 [5];
  ulong local_98;
  uint64_t rng_counter;
  
  local_98 = (ulong)size;
  if (filter->Size != size) {
    return false;
  }
  rng_counter = 0x726b2b9d438b9d4d;
  uVar16 = binary_fuse_rng_splitmix64(&rng_counter);
  filter->Seed = uVar16;
  __ptr = calloc((ulong)(size + 1),8);
  uVar19 = (ulong)filter->ArrayLength;
  __ptr_00 = malloc(uVar19 * 4);
  __ptr_01 = calloc(uVar19,1);
  __ptr_02 = malloc((ulong)size);
  __ptr_03 = calloc(uVar19,8);
  cVar9 = '\0';
  do {
    cVar27 = cVar9;
    uVar32 = 1 << (cVar27 + 0x41U & 0x1f);
    cVar9 = cVar27 + '\x01';
  } while (uVar32 < filter->SegmentCount);
  __ptr_04 = malloc((ulong)uVar32 * 4);
  auVar34._0_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
  auVar34._4_4_ = -(uint)((int)__ptr_01 == 0 && (int)((ulong)__ptr_01 >> 0x20) == 0);
  auVar34._8_4_ = -(uint)((int)((ulong)__ptr_02 >> 0x20) == 0 && (int)__ptr_02 == 0);
  auVar34._12_4_ = -(uint)((int)__ptr_03 == 0 && (int)((ulong)__ptr_03 >> 0x20) == 0);
  iVar11 = movmskps((int)__ptr_04,auVar34);
  _Var31 = false;
  if (((iVar11 == 0) && (__ptr != (void *)0x0)) && (__ptr_04 != (void *)0x0)) {
    *(undefined8 *)((long)__ptr + (ulong)size * 8) = 1;
    iVar11 = 0;
    while (iVar11 != 100) {
      iVar11 = iVar11 + 1;
      length = local_98 & 0xffffffff;
      uVar17 = 0;
      for (uVar23 = 0; uVar32 != uVar23; uVar23 = uVar23 + 1) {
        *(int *)((long)__ptr_04 + uVar23 * 4) = (int)(uVar17 >> (cVar27 + 0x41U & 0x3f));
        uVar17 = uVar17 + length;
      }
      for (uVar17 = 0; uVar17 != length; uVar17 = uVar17 + 1) {
        uVar18 = binary_fuse_murmur64(keys[uVar17] + uVar16);
        uVar23 = uVar18 >> (-(cVar27 + '\x01') & 0x3fU);
        while( true ) {
          uVar14 = *(uint *)((long)__ptr_04 + uVar23 * 4);
          if (*(long *)((long)__ptr + (ulong)uVar14 * 8) == 0) break;
          uVar23 = (ulong)((int)uVar23 + 1U & uVar32 - 1);
        }
        *(uint64_t *)((long)__ptr + (ulong)uVar14 * 8) = uVar18;
        *(uint *)((long)__ptr_04 + uVar23 * 4) = uVar14 + 1;
      }
      iVar13 = 0;
      bVar6 = false;
      for (uVar17 = 0; length != uVar17; uVar17 = uVar17 + 1) {
        uVar23 = *(ulong *)((long)__ptr + uVar17 * 8);
        uVar12 = binary_fuse16_hash(0,uVar23,filter);
        uVar33 = (ulong)uVar12;
        *(char *)((long)__ptr_01 + uVar33) = *(char *)((long)__ptr_01 + uVar33) + '\x04';
        puVar1 = (ulong *)((long)__ptr_03 + uVar33 * 8);
        *puVar1 = *puVar1 ^ uVar23;
        uVar12 = binary_fuse16_hash(1,uVar23,filter);
        uVar30 = (ulong)uVar12;
        *(byte *)((long)__ptr_01 + uVar30) = (*(byte *)((long)__ptr_01 + uVar30) ^ 1) + 4;
        puVar1 = (ulong *)((long)__ptr_03 + uVar30 * 8);
        *puVar1 = *puVar1 ^ uVar23;
        uVar12 = binary_fuse16_hash(2,uVar23,filter);
        uVar20 = (ulong)uVar12;
        bVar21 = *(char *)((long)__ptr_01 + uVar20) + 4;
        uVar2 = *(ulong *)((long)__ptr_03 + uVar20 * 8);
        uVar26 = uVar2 ^ uVar23;
        *(ulong *)((long)__ptr_03 + uVar20 * 8) = uVar26;
        bVar10 = bVar21 ^ 2;
        *(byte *)((long)__ptr_01 + uVar20) = bVar10;
        uVar3 = *(ulong *)((long)__ptr_03 + uVar33 * 8);
        uVar4 = *(ulong *)((long)__ptr_03 + uVar30 * 8);
        if (((uVar26 & uVar3 & uVar4) == 0) &&
           ((((uVar3 == 0 && (*(char *)((long)__ptr_01 + uVar33) == '\b')) ||
             ((uVar4 == 0 && (*(char *)((long)__ptr_01 + uVar30) == '\b')))) ||
            ((uVar2 == uVar23 && (bVar21 == 10)))))) {
          iVar13 = iVar13 + 1;
          *(char *)((long)__ptr_01 + uVar33) = *(char *)((long)__ptr_01 + uVar33) + -4;
          *(ulong *)((long)__ptr_03 + uVar33 * 8) = uVar3 ^ uVar23;
          bVar10 = *(byte *)((long)__ptr_01 + uVar30);
          puVar1 = (ulong *)((long)__ptr_03 + uVar30 * 8);
          *puVar1 = *puVar1 ^ uVar23;
          *(byte *)((long)__ptr_01 + uVar30) = (bVar10 ^ 1) - 4;
          bVar10 = (*(byte *)((long)__ptr_01 + uVar20) ^ 2) - 4;
          *(byte *)((long)__ptr_01 + uVar20) = bVar10;
          puVar1 = (ulong *)((long)__ptr_03 + uVar20 * 8);
          *puVar1 = *puVar1 ^ uVar23;
        }
        bVar8 = true;
        if (*(byte *)((long)__ptr_01 + uVar33) < 4) {
          bVar6 = bVar8;
        }
        bVar7 = bVar6;
        if (*(byte *)((long)__ptr_01 + uVar30) < 4) {
          bVar7 = bVar8;
        }
        bVar6 = bVar8;
        if (3 < bVar10) {
          bVar6 = bVar7;
        }
      }
      if (!bVar6) {
        uVar14 = 0;
        for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
          *(int *)((long)__ptr_00 + (ulong)uVar14 * 4) = (int)uVar17;
          uVar14 = uVar14 + ((*(byte *)((long)__ptr_01 + uVar17) & 0xfc) == 4);
        }
        local_e8 = 0;
        uVar25 = 0xffffffff;
        do {
          iVar24 = -uVar14;
          do {
            uVar14 = uVar14 - 1;
            uVar22 = (uint)local_e8;
            if (iVar24 == 0) {
              if (uVar22 + iVar13 == (int)local_98) goto LAB_00103760;
              if (iVar13 != 0) {
                local_98 = binary_fuse_sort_and_remove_dup(keys,length);
                length = local_98 & 0xffffffff;
              }
              goto LAB_001036f0;
            }
            uVar17 = (ulong)*(uint *)((long)__ptr_00 + (ulong)uVar14 * 4);
            bVar10 = *(byte *)((long)__ptr_01 + uVar17);
            iVar24 = iVar24 + 1;
          } while ((bVar10 & 0xfc) != 4);
          uVar16 = *(uint64_t *)((long)__ptr_03 + uVar17 * 8);
          uVar12 = binary_fuse16_hash(1,uVar16,filter);
          h012[1] = uVar12;
          h012[2] = binary_fuse16_hash(2,uVar16,filter);
          h012[3] = binary_fuse16_hash(0,uVar16,filter);
          h012[4] = uVar12;
          uVar29 = bVar10 & 3;
          bVar28 = (byte)uVar29;
          *(byte *)((long)__ptr_02 + local_e8) = bVar28;
          *(uint64_t *)((long)__ptr + local_e8 * 8) = uVar16;
          local_e8 = (ulong)(uVar22 + 1);
          uVar17 = (ulong)h012[(ulong)uVar29 + 1];
          *(uint32_t *)((long)__ptr_00 + (ulong)uVar14 * 4) = h012[(ulong)uVar29 + 1];
          bVar10 = *(byte *)((long)__ptr_01 + uVar17);
          uVar14 = (uint)((bVar10 & 0xfc) == 8);
          bVar21 = bVar28 - 2;
          if (bVar28 < 2) {
            bVar21 = bVar28 + 1;
          }
          puVar1 = (ulong *)((long)__ptr_03 + uVar17 * 8);
          *puVar1 = *puVar1 ^ uVar16;
          *(byte *)((long)__ptr_01 + uVar17) = bVar21 ^ bVar10 - 4;
          uVar17 = (ulong)h012[uVar29 + 2];
          *(uint32_t *)((long)__ptr_00 + (ulong)(uVar14 - iVar24) * 4) = h012[uVar29 + 2];
          uVar14 = (((*(byte *)((long)__ptr_01 + uVar17) & 0xfc) == 8) + uVar14) - iVar24;
          bVar10 = (char)(uVar29 + 2) - 3;
          if ((ulong)uVar29 == 0) {
            bVar10 = 2;
          }
          *(byte *)((long)__ptr_01 + uVar17) = bVar10 ^ *(byte *)((long)__ptr_01 + uVar17) - 4;
          puVar1 = (ulong *)((long)__ptr_03 + uVar17 * 8);
          *puVar1 = *puVar1 ^ uVar16;
          uVar25 = uVar25 + 1;
        } while( true );
      }
LAB_001036f0:
      memset(__ptr,0,length << 3);
      memset(__ptr_01,0,uVar19);
      memset(__ptr_03,0,uVar19 * 8);
      uVar16 = binary_fuse_rng_splitmix64(&rng_counter);
      filter->Seed = uVar16;
    }
    _Var31 = false;
  }
LAB_00103815:
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(__ptr_03);
  free(__ptr);
  free(__ptr_04);
  return _Var31;
LAB_00103760:
  for (; uVar25 < uVar22; uVar25 = uVar25 - 1) {
    uVar16 = *(uint64_t *)((long)__ptr + (ulong)uVar25 * 8);
    uVar19 = (ulong)*(byte *)((long)__ptr_02 + (ulong)uVar25);
    uVar12 = binary_fuse16_hash(0,uVar16,filter);
    h012[0] = uVar12;
    uVar15 = binary_fuse16_hash(1,uVar16,filter);
    h012[1] = uVar15;
    h012[2] = binary_fuse16_hash(2,uVar16,filter);
    h012[3] = uVar12;
    h012[4] = uVar15;
    puVar5 = filter->Fingerprints;
    puVar5[h012[uVar19]] =
         (ushort)(uVar16 >> 0x20) ^ (ushort)uVar16 ^ puVar5[h012[uVar19 + 1]] ^
         puVar5[h012[uVar19 + 2]];
  }
  _Var31 = true;
  goto LAB_00103815;
}

Assistant:

static inline bool binary_fuse16_populate(uint64_t *keys, uint32_t size,
                           binary_fuse16_t *filter) {
  if (size != filter->Size) {
    return false;
  }

  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1U << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = (uint32_t)(((uint64_t)i * size) >> blockBits);
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse16_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse16_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1U;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse16_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2U;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1U;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2U;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2U) == 1) ? 1U : 0U;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2U) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse16_hash(0, hash, filter);
        h012[1] = binary_fuse16_hash(1, hash, filter);
        h012[2] = binary_fuse16_hash(2, hash, filter);
        h012[3] = binary_fuse16_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3U;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2U) == 2 ? 1U : 0U);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2U) == 2 ? 1U : 0U);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    }
    if(duplicates > 0) {
      size = (uint32_t)binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint16_t xor2 = binary_fuse16_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse16_hash(0, hash, filter);
    h012[1] = binary_fuse16_hash(1, hash, filter);
    h012[2] = binary_fuse16_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = (uint16_t)(
        (uint32_t)xor2 ^
        (uint32_t)filter->Fingerprints[h012[found + 1]] ^
        (uint32_t)filter->Fingerprints[h012[found + 2]]);
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}